

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Person.cpp
# Opt level: O0

void __thiscall Person::Person(Person *this,string *name,string *id,Address *address)

{
  int iVar1;
  string local_58 [48];
  Address *local_28;
  Address *address_local;
  string *id_local;
  string *name_local;
  Person *this_local;
  
  this->_vptr_Person = (_func_int **)&PTR_validate_0010ad88;
  local_28 = address;
  address_local = (Address *)id;
  id_local = name;
  name_local = (string *)this;
  std::__cxx11::string::string((string *)&this->name);
  std::__cxx11::string::string((string *)&this->id);
  Address::Address(&this->address);
  std::__cxx11::string::operator=((string *)&this->name,(string *)id_local);
  std::__cxx11::string::operator=((string *)&this->id,(string *)address_local);
  Address::operator=(&this->address,local_28);
  std::__cxx11::string::string(local_58,(string *)address_local);
  iVar1 = (**this->_vptr_Person)(this,local_58);
  std::__cxx11::string::~string(local_58);
  if ((((byte)iVar1 ^ 0xff) & 1) == 0) {
    return;
  }
  std::operator<<((ostream *)&std::cout,"Invalid id");
  exit(1);
}

Assistant:

Person::Person(const string &name, const string &id, const Address &address) {
    this->name = name;
    this->id = id;
    this->address = address;
    if (!validate(id)) { // if the id was invalid exit the program
        cout << "Invalid id";
        exit(1);
    }
}